

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O0

bool SignSignature(SigningProvider *provider,CTransaction *txFrom,CMutableTransaction *txTo,uint nIn
                  ,int nHashType,SignatureData *sig_data)

{
  long lVar1;
  bool bVar2;
  CAmount *amount;
  CAmount *pCVar3;
  reference txTo_00;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  uint in_ECX;
  undefined4 in_R8D;
  CScript *in_R9;
  long in_FS_OFFSET;
  CTxOut *txout;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  amount = (CAmount *)(ulong)in_ECX;
  pCVar3 = (CAmount *)std::vector<CTxIn,_std::allocator<CTxIn>_>::size(in_stack_ffffffffffffff98);
  if (pCVar3 <= amount) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x6b,
                  "bool SignSignature(const SigningProvider &, const CTransaction &, CMutableTransaction &, unsigned int, int, SignatureData &)"
                 );
  }
  txTo_00 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa0);
  uVar4 = (ulong)(txTo_00->prevout).n;
  sVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff98);
  if (uVar4 < sVar5) {
    pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                        CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa0);
    bVar2 = SignSignature((SigningProvider *)CONCAT44(in_ECX,in_R8D),in_R9,
                          (CMutableTransaction *)txTo_00,(uint)((ulong)pvVar6 >> 0x20),amount,
                          (int)(uVar4 >> 0x20),(SignatureData *)CONCAT44(nIn,nHashType));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return bVar2;
    }
    __stack_chk_fail();
  }
  __assert_fail("txin.prevout.n < txFrom.vout.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                ,0x6d,
                "bool SignSignature(const SigningProvider &, const CTransaction &, CMutableTransaction &, unsigned int, int, SignatureData &)"
               );
}

Assistant:

bool SignSignature(const SigningProvider &provider, const CTransaction& txFrom, CMutableTransaction& txTo, unsigned int nIn, int nHashType, SignatureData& sig_data)
{
    assert(nIn < txTo.vin.size());
    const CTxIn& txin = txTo.vin[nIn];
    assert(txin.prevout.n < txFrom.vout.size());
    const CTxOut& txout = txFrom.vout[txin.prevout.n];

    return SignSignature(provider, txout.scriptPubKey, txTo, nIn, txout.nValue, nHashType, sig_data);
}